

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O3

PageMarkBitVector * __thiscall
Memory::HeapBlockMap64::GetPageMarkBitVector(HeapBlockMap64 *this,void *address)

{
  L2MapChunk *this_00;
  Node *extraout_RAX;
  Node *pNVar1;
  BVStatic<256UL> *pBVar2;
  
  for (pNVar1 = this->list; pNVar1 != (Node *)0x0; pNVar1 = pNVar1->next) {
    if (pNVar1->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_002168b5;
  }
  GetPageMarkBitVector();
  pNVar1 = extraout_RAX;
LAB_002168b5:
  this_00 = (pNVar1->map).map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 != (L2MapChunk *)0x0) {
    pBVar2 = BVStatic<65536ul>::GetRange<256ul>
                       ((BVStatic<65536ul> *)this_00,(uint)address >> 4 & 0xff00);
    return pBVar2;
  }
  return (PageMarkBitVector *)0x0;
}

Assistant:

HeapBlockMap32::PageMarkBitVector *
HeapBlockMap64::GetPageMarkBitVector(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetPageMarkBitVector(address);
}